

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  xmlXPathFunction p_Var4;
  byte *pbVar5;
  int funcIndex;
  xmlXPathFunction unaff_R12;
  uint uVar6;
  
  if (name != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    if (ns_uri == (xmlChar *)0x0) {
      bVar2 = *name;
      if (bVar2 == 0) {
        uVar6 = 5;
      }
      else {
        pbVar5 = name + 1;
        uVar6 = 0x1505;
        do {
          uVar6 = (uint)bVar2 + uVar6 * 0x21;
          bVar2 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar2 != 0);
        uVar6 = uVar6 & 0x3f;
      }
      do {
        bVar2 = xmlXPathSFHash[(int)uVar6];
        if (bVar2 == 0xff) break;
        iVar3 = strcmp(xmlXPathStandardFunctions[bVar2].name,(char *)name);
        if (iVar3 == 0) {
          unaff_R12 = xmlXPathStandardFunctions[bVar2].func;
        }
        else {
          bVar1 = 0x3e < (int)uVar6;
          uVar6 = uVar6 + 1;
          if (bVar1) {
            uVar6 = 0;
          }
        }
      } while (iVar3 != 0);
      if (bVar2 != 0xff) {
        return unaff_R12;
      }
    }
    if ((ctxt->funcLookupFunc != (xmlXPathFuncLookupFunc)0x0) &&
       (p_Var4 = (*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
       p_Var4 != (xmlXPathFunction)0x0)) {
      return p_Var4;
    }
    if (ctxt->funcHash != (xmlHashTablePtr)0x0) {
      p_Var4 = (xmlXPathFunction)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
      return p_Var4;
    }
  }
  return (xmlXPathFunction)0x0;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;
    void *payload;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ns_uri == NULL) {
        int bucketIndex = xmlXPathSFComputeHash(name) % SF_HASH_SIZE;

        while (xmlXPathSFHash[bucketIndex] != UCHAR_MAX) {
            int funcIndex = xmlXPathSFHash[bucketIndex];

            if (strcmp(xmlXPathStandardFunctions[funcIndex].name,
                       (char *) name) == 0)
                return(xmlXPathStandardFunctions[funcIndex].func);

            bucketIndex += 1;
            if (bucketIndex >= SF_HASH_SIZE)
                bucketIndex = 0;
        }
    }

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

    payload = xmlHashLookup2(ctxt->funcHash, name, ns_uri);
    memcpy(&ret, &payload, sizeof(payload));

    return(ret);
}